

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseKernel.hh
# Opt level: O3

void __thiscall
OpenMesh::BaseKernel::
add_property<OpenMesh::DefaultTraits::HalfedgeT<OpenMesh::FinalMeshItemsT<MyTraits,true>::ITraits,OpenMesh::FinalMeshItemsT<MyTraits,true>::Refs>>
          (BaseKernel *this,
          HPropHandleT<OpenMesh::DefaultTraits::HalfedgeT<OpenMesh::FinalMeshItemsT<MyTraits,_true>::ITraits,_OpenMesh::FinalMeshItemsT<MyTraits,_true>::Refs>_>
          *_ph,string *_name)

{
  pointer ppBVar1;
  BaseProperty *pBVar2;
  BasePropHandleT<OpenMesh::DefaultTraits::HalfedgeT<OpenMesh::FinalMeshItemsT<MyTraits,_true>::ITraits,_OpenMesh::FinalMeshItemsT<MyTraits,_true>::Refs>_>
  BVar3;
  int iVar4;
  undefined4 extraout_var;
  pointer ppBVar5;
  HalfedgeT<OpenMesh::FinalMeshItemsT<MyTraits,_true>::ITraits,_OpenMesh::FinalMeshItemsT<MyTraits,_true>::Refs>
  local_21;
  
  BVar3 = PropertyContainer::
          add<OpenMesh::DefaultTraits::HalfedgeT<OpenMesh::FinalMeshItemsT<MyTraits,true>::ITraits,OpenMesh::FinalMeshItemsT<MyTraits,true>::Refs>>
                    (&this->hprops_,&local_21,_name);
  (_ph->
  super_BasePropHandleT<OpenMesh::DefaultTraits::HalfedgeT<OpenMesh::FinalMeshItemsT<MyTraits,_true>::ITraits,_OpenMesh::FinalMeshItemsT<MyTraits,_true>::Refs>_>
  ).super_BaseHandle.idx_ = (int)BVar3.super_BaseHandle.idx_;
  iVar4 = (*this->_vptr_BaseKernel[3])(this);
  ppBVar1 = (this->hprops_).properties_.
            super__Vector_base<OpenMesh::BaseProperty_*,_std::allocator<OpenMesh::BaseProperty_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  for (ppBVar5 = (this->hprops_).properties_.
                 super__Vector_base<OpenMesh::BaseProperty_*,_std::allocator<OpenMesh::BaseProperty_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppBVar5 != ppBVar1;
      ppBVar5 = ppBVar5 + 1) {
    pBVar2 = *ppBVar5;
    if (pBVar2 != (BaseProperty *)0x0) {
      (*pBVar2->_vptr_BaseProperty[3])(pBVar2,CONCAT44(extraout_var,iVar4));
    }
  }
  return;
}

Assistant:

void add_property( HPropHandleT<T>& _ph, const std::string& _name="<hprop>")
  {
    _ph = HPropHandleT<T>( hprops_.add(T(), _name) );
    hprops_.resize(n_halfedges());
  }